

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

void mbedtls_ssl_free(mbedtls_ssl_context *ssl)

{
  char *__s;
  size_t len;
  
  if (ssl != (mbedtls_ssl_context *)0x0) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,0x12dd,"=> free");
    if (ssl->out_buf != (uchar *)0x0) {
      mbedtls_zeroize_and_free(ssl->out_buf,0x42d);
      ssl->out_buf = (uchar *)0x0;
    }
    if (ssl->in_buf != (uchar *)0x0) {
      mbedtls_zeroize_and_free(ssl->in_buf,0x42d);
      ssl->in_buf = (uchar *)0x0;
    }
    if (ssl->transform != (mbedtls_ssl_transform *)0x0) {
      mbedtls_ssl_transform_free(ssl->transform);
      free(ssl->transform);
    }
    if (ssl->handshake != (mbedtls_ssl_handshake_params *)0x0) {
      mbedtls_ssl_handshake_free(ssl);
      free(ssl->handshake);
      mbedtls_ssl_transform_free(ssl->transform_negotiate);
      free(ssl->transform_negotiate);
      mbedtls_ssl_session_free(ssl->session_negotiate);
      free(ssl->session_negotiate);
    }
    if (ssl->session != (mbedtls_ssl_session *)0x0) {
      mbedtls_ssl_session_free(ssl->session);
      free(ssl->session);
    }
    __s = ssl->hostname;
    if (__s != (char *)0x0) {
      len = strlen(__s);
      mbedtls_zeroize_and_free(__s,len);
    }
    free(ssl->cli_id);
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,0x131b,"<= free");
    mbedtls_platform_zeroize(ssl,0x1c8);
    return;
  }
  return;
}

Assistant:

void mbedtls_ssl_free(mbedtls_ssl_context *ssl)
{
    if (ssl == NULL) {
        return;
    }

    MBEDTLS_SSL_DEBUG_MSG(2, ("=> free"));

    if (ssl->out_buf != NULL) {
#if defined(MBEDTLS_SSL_VARIABLE_BUFFER_LENGTH)
        size_t out_buf_len = ssl->out_buf_len;
#else
        size_t out_buf_len = MBEDTLS_SSL_OUT_BUFFER_LEN;
#endif

        mbedtls_zeroize_and_free(ssl->out_buf, out_buf_len);
        ssl->out_buf = NULL;
    }

    if (ssl->in_buf != NULL) {
#if defined(MBEDTLS_SSL_VARIABLE_BUFFER_LENGTH)
        size_t in_buf_len = ssl->in_buf_len;
#else
        size_t in_buf_len = MBEDTLS_SSL_IN_BUFFER_LEN;
#endif

        mbedtls_zeroize_and_free(ssl->in_buf, in_buf_len);
        ssl->in_buf = NULL;
    }

    if (ssl->transform) {
        mbedtls_ssl_transform_free(ssl->transform);
        mbedtls_free(ssl->transform);
    }

    if (ssl->handshake) {
        mbedtls_ssl_handshake_free(ssl);
        mbedtls_free(ssl->handshake);

#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
        mbedtls_ssl_transform_free(ssl->transform_negotiate);
        mbedtls_free(ssl->transform_negotiate);
#endif

        mbedtls_ssl_session_free(ssl->session_negotiate);
        mbedtls_free(ssl->session_negotiate);
    }

#if defined(MBEDTLS_SSL_PROTO_TLS1_3)
    mbedtls_ssl_transform_free(ssl->transform_application);
    mbedtls_free(ssl->transform_application);
#endif /* MBEDTLS_SSL_PROTO_TLS1_3 */

    if (ssl->session) {
        mbedtls_ssl_session_free(ssl->session);
        mbedtls_free(ssl->session);
    }

#if defined(MBEDTLS_X509_CRT_PARSE_C)
    if (ssl->hostname != NULL) {
        mbedtls_zeroize_and_free(ssl->hostname, strlen(ssl->hostname));
    }
#endif

#if defined(MBEDTLS_SSL_DTLS_HELLO_VERIFY) && defined(MBEDTLS_SSL_SRV_C)
    mbedtls_free(ssl->cli_id);
#endif

    MBEDTLS_SSL_DEBUG_MSG(2, ("<= free"));

    /* Actually clear after last debug message */
    mbedtls_platform_zeroize(ssl, sizeof(mbedtls_ssl_context));
}